

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O2

int writeOffset(FILE *stream,writeoutvar *wovar,per_transfer *per,CURLcode per_result,_Bool use_json
               )

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  curl_off_t offinfo;
  
  offinfo = 0;
  if ((wovar->ci == CURLINFO_NONE) ||
     (iVar1 = curl_easy_getinfo(per->curl,wovar->ci,&offinfo), iVar1 != 0)) {
    if (!use_json) {
      return 1;
    }
    pcVar3 = "\"%s\":null";
    pcVar2 = wovar->name;
  }
  else {
    if (use_json) {
      curl_mfprintf(stream,"\"%s\":",wovar->name);
    }
    pcVar3 = "%ld";
    pcVar2 = (char *)offinfo;
  }
  curl_mfprintf(stream,pcVar3,pcVar2);
  return 1;
}

Assistant:

static int writeOffset(FILE *stream, const struct writeoutvar *wovar,
                       struct per_transfer *per, CURLcode per_result,
                       bool use_json)
{
  bool valid = false;
  curl_off_t offinfo = 0;

  (void)per;
  (void)per_result;
  DEBUGASSERT(wovar->writefunc == writeOffset);

  if(wovar->ci) {
    if(!curl_easy_getinfo(per->curl, wovar->ci, &offinfo))
      valid = true;
  }
  else {
    DEBUGASSERT(0);
  }

  if(valid) {
    if(use_json)
      fprintf(stream, "\"%s\":", wovar->name);

    fprintf(stream, "%" CURL_FORMAT_CURL_OFF_T, offinfo);
  }
  else {
    if(use_json)
      fprintf(stream, "\"%s\":null", wovar->name);
  }

  return 1; /* return 1 if anything was written */
}